

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psmodule.c
# Opt level: O0

FT_Error ps_unicodes_init(FT_Memory memory,PS_Unicodes table,FT_UInt num_glyphs,
                         PS_GetGlyphNameFunc get_glyph_name,PS_FreeGlyphNameFunc free_glyph_name,
                         FT_Pointer glyph_data)

{
  FT_UInt32 uni_char_00;
  uint uVar1;
  PS_UniMap *pPVar2;
  char *gname_00;
  ulong uVar3;
  char *gname;
  PS_UniMap *pPStack_a8;
  FT_UInt32 uni_char;
  PS_UniMap *map;
  FT_UInt count;
  FT_UInt n;
  FT_UInt extra_glyphs [10];
  FT_UInt local_68 [2];
  FT_UInt extra_glyph_list_states [10];
  FT_Error error;
  FT_Pointer glyph_data_local;
  PS_FreeGlyphNameFunc free_glyph_name_local;
  PS_GetGlyphNameFunc get_glyph_name_local;
  FT_UInt num_glyphs_local;
  PS_Unicodes table_local;
  FT_Memory memory_local;
  
  memset(local_68,0,0x28);
  table->num_maps = 0;
  table->maps = (PS_UniMap *)0x0;
  pPVar2 = (PS_UniMap *)
           ft_mem_realloc(memory,8,0,(ulong)(num_glyphs + 10),(void *)0x0,
                          (FT_Error *)(extra_glyph_list_states + 9));
  table->maps = pPVar2;
  if (extra_glyph_list_states[9] == 0) {
    pPStack_a8 = table->maps;
    for (map._4_4_ = 0; map._4_4_ < num_glyphs; map._4_4_ = map._4_4_ + 1) {
      gname_00 = (*get_glyph_name)(glyph_data,map._4_4_);
      if (gname_00 != (char *)0x0) {
        ps_check_extra_glyph_name(gname_00,map._4_4_,&count,local_68);
        uni_char_00 = ps_unicode_value(gname_00);
        if ((uni_char_00 & 0x7fffffff) != 0) {
          ps_check_extra_glyph_unicode(uni_char_00,local_68);
          pPStack_a8->unicode = uni_char_00;
          pPStack_a8->glyph_index = map._4_4_;
          pPStack_a8 = pPStack_a8 + 1;
        }
        if (free_glyph_name != (PS_FreeGlyphNameFunc)0x0) {
          (*free_glyph_name)(glyph_data,gname_00);
        }
      }
    }
    for (map._4_4_ = 0; map._4_4_ < 10; map._4_4_ = map._4_4_ + 1) {
      if (local_68[map._4_4_] == 1) {
        pPStack_a8->unicode = ft_extra_glyph_unicodes[map._4_4_];
        pPStack_a8->glyph_index = (&count)[map._4_4_];
        pPStack_a8 = pPStack_a8 + 1;
      }
    }
    uVar3 = (long)pPStack_a8 - (long)table->maps >> 3;
    uVar1 = (uint)uVar3;
    if (uVar1 == 0) {
      ft_mem_free(memory,table->maps);
      table->maps = (PS_UniMap *)0x0;
      if (extra_glyph_list_states[9] == 0) {
        extra_glyph_list_states[9] = 0xa3;
      }
    }
    else {
      if (uVar1 < num_glyphs >> 1) {
        pPVar2 = (PS_UniMap *)
                 ft_mem_realloc(memory,8,(ulong)num_glyphs,uVar3 & 0xffffffff,table->maps,
                                (FT_Error *)(extra_glyph_list_states + 9));
        table->maps = pPVar2;
        extra_glyph_list_states[9] = 0;
      }
      qsort(table->maps,uVar3 & 0xffffffff,8,compare_uni_maps);
    }
    table->num_maps = uVar1;
  }
  return extra_glyph_list_states[9];
}

Assistant:

static FT_Error
  ps_unicodes_init( FT_Memory             memory,
                    PS_Unicodes           table,
                    FT_UInt               num_glyphs,
                    PS_GetGlyphNameFunc   get_glyph_name,
                    PS_FreeGlyphNameFunc  free_glyph_name,
                    FT_Pointer            glyph_data )
  {
    FT_Error  error;

    FT_UInt  extra_glyph_list_states[] = { 0, 0, 0, 0, 0, 0, 0, 0, 0, 0 };
    FT_UInt  extra_glyphs[EXTRA_GLYPH_LIST_SIZE];


    /* we first allocate the table */
    table->num_maps = 0;
    table->maps     = NULL;

    if ( !FT_NEW_ARRAY( table->maps, num_glyphs + EXTRA_GLYPH_LIST_SIZE ) )
    {
      FT_UInt     n;
      FT_UInt     count;
      PS_UniMap*  map;
      FT_UInt32   uni_char;


      map = table->maps;

      for ( n = 0; n < num_glyphs; n++ )
      {
        const char*  gname = get_glyph_name( glyph_data, n );


        if ( gname )
        {
          ps_check_extra_glyph_name( gname, n,
                                     extra_glyphs, extra_glyph_list_states );
          uni_char = ps_unicode_value( gname );

          if ( BASE_GLYPH( uni_char ) != 0 )
          {
            ps_check_extra_glyph_unicode( uni_char,
                                          extra_glyph_list_states );
            map->unicode     = uni_char;
            map->glyph_index = n;
            map++;
          }

          if ( free_glyph_name )
            free_glyph_name( glyph_data, gname );
        }
      }

      for ( n = 0; n < EXTRA_GLYPH_LIST_SIZE; n++ )
      {
        if ( extra_glyph_list_states[n] == 1 )
        {
          /* This glyph name has an additional representation. */
          /* Add it to the cmap.                               */

          map->unicode     = ft_extra_glyph_unicodes[n];
          map->glyph_index = extra_glyphs[n];
          map++;
        }
      }

      /* now compress the table a bit */
      count = (FT_UInt)( map - table->maps );

      if ( count == 0 )
      {
        /* No unicode chars here! */
        FT_FREE( table->maps );
        if ( !error )
          error = FT_THROW( No_Unicode_Glyph_Name );
      }
      else
      {
        /* Reallocate if the number of used entries is much smaller. */
        if ( count < num_glyphs / 2 )
        {
          (void)FT_RENEW_ARRAY( table->maps, num_glyphs, count );
          error = FT_Err_Ok;
        }

        /* Sort the table in increasing order of unicode values, */
        /* taking care of glyph variants.                        */
        ft_qsort( table->maps, count, sizeof ( PS_UniMap ),
                  compare_uni_maps );
      }

      table->num_maps = count;
    }

    return error;
  }